

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_user_info.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::BasicUserInfo::GetDefaultAccount_abi_cxx11_
          (string *__return_storage_ptr__,BasicUserInfo *this)

{
  BasicUserInfo *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->default_account_);
  return __return_storage_ptr__;
}

Assistant:

std::string BasicUserInfo::GetDefaultAccount()
{
    return default_account_;
}